

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void __thiscall
file<std::basic_ofstream<char,_std::char_traits<char>_>_>::~file
          (file<std::basic_ofstream<char,_std::char_traits<char>_>_> *this,void **vtt)

{
  std::ofstream::~ofstream((ofstream *)this);
  std::__cxx11::string::~string
            ((string *)
             &(this->super_basic_ofstream<char,_std::char_traits<char>_>).
              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  return;
}

Assistant:

file(const std::string& name)  // non explicit
      : std::string{name}, TFStream{name} {}